

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_sizeof(lua_State *L)

{
  CTState *cts;
  CTypeID id;
  CTSize CVar1;
  CType *ct;
  ulong uVar2;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  if (((L->base->field_4).it >> 0xf == 0x1fff5) &&
     (uVar2 = (ulong)L->base->field_4 & 0x7fffffffffff, *(char *)(uVar2 + 8) < '\0')) {
    CVar1 = *(CTSize *)(uVar2 - 4);
LAB_0011f1eb:
    L->top[-1].n = (double)(int)CVar1;
  }
  else {
    ct = lj_ctype_rawref(cts,id);
    if ((ct->info & 0xd0100000) == 0x10100000) {
      CVar1 = ffi_checkint(L,2);
      CVar1 = lj_ctype_vlsize(cts,ct,CVar1);
LAB_0011f1e6:
      if (CVar1 != 0xffffffff) goto LAB_0011f1eb;
    }
    else if (ct->info < 0x60000000) {
      CVar1 = ct->size;
      goto LAB_0011f1e6;
    }
    L->top[-1].u64 = 0xffffffffffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_sizeof)	LJLIB_REC(ffi_xof FF_ffi_sizeof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz;
  if (LJ_UNLIKELY(tviscdata(L->base) && cdataisv(cdataV(L->base)))) {
    sz = cdatavlen(cdataV(L->base));
  } else {
    CType *ct = lj_ctype_rawref(cts, id);
    if (ctype_isvltype(ct->info))
      sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
    else
      sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_INVALID;
    if (LJ_UNLIKELY(sz == CTSIZE_INVALID)) {
      setnilV(L->top-1);
      return 1;
    }
  }
  setintV(L->top-1, (int32_t)sz);
  return 1;
}